

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  int iVar1;
  TestPartResult *pTVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *in_RCX;
  internal *this;
  int i;
  int iVar5;
  string kIndent;
  string location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string message;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\n');
  if (0 < (int)((ulong)((long)(result->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    iVar5 = 0;
    i = 0;
    do {
      pTVar2 = TestResult::GetTestPartResult(result,i);
      iVar1 = (int)in_RCX;
      if (pTVar2->type_ - kNonFatalFailure < 2) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
        if (iVar5 == 0) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,(char *)local_d0,local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"failures",8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": [\n",5);
        }
        this = (internal *)(pTVar2->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_b0,this,(char *)(ulong)(uint)pTVar2->line_number_,iVar1);
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        std::__cxx11::string::append((char *)local_90);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        in_RCX = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_RCX) {
          local_70.field_2._M_allocated_capacity = *in_RCX;
          local_70.field_2._8_8_ = plVar4[3];
        }
        else {
          local_70.field_2._M_allocated_capacity = *in_RCX;
          local_70._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)in_RCX;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        EscapeJson(&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  {\n",4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"failure\": \"",0x10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\n",3);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"type\": \"\"\n",0xf);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  }",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        iVar5 = iVar5 + 1;
      }
      i = i + 1;
      iVar1 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar1 * -0x49249249) != i + iVar1 * 0x49249249 < 0);
    if (0 < iVar5) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_d0,local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\b');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}